

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_ecc_edwards_decompress(void)

{
  size_t sVar1;
  size_t sVar2;
  EdwardsPoint *pEVar3;
  EdwardsPoint *pEVar4;
  EdwardsPoint *a_1;
  mp_int *Y;
  EdwardsPoint *A;
  size_t i;
  size_t p;
  EdwardsPoint *a;
  mp_int *y;
  EdwardsCurve *ec;
  
  y = (mp_int *)ecurve();
  a = (EdwardsPoint *)mp_new(0x90);
  p = (size_t)ecc_edwards_point_new_from_y((EdwardsCurve *)y,(mp_int *)a,0);
  if ((EdwardsPoint *)p != (EdwardsPoint *)0x0) {
    ecc_edwards_point_free((EdwardsPoint *)p);
  }
  i = 0;
  while( true ) {
    sVar1 = i;
    sVar2 = (*looplimit)(2);
    if (sVar2 <= sVar1) break;
    A = (EdwardsPoint *)0x0;
    while( true ) {
      pEVar4 = A;
      pEVar3 = (EdwardsPoint *)(*looplimit)(5);
      if (pEVar3 <= pEVar4) break;
      Y = (mp_int *)epoint((EdwardsCurve *)y,(size_t)A);
      ecc_edwards_get_affine((EdwardsPoint *)Y,(mp_int **)0x0,(mp_int **)&a_1);
      mp_copy_into((mp_int *)a,(mp_int *)a_1);
      mp_free((mp_int *)a_1);
      ecc_edwards_point_free((EdwardsPoint *)Y);
      log_start();
      pEVar4 = ecc_edwards_point_new_from_y((EdwardsCurve *)y,(mp_int *)a,(uint)i);
      log_end();
      ecc_edwards_point_free(pEVar4);
      A = (EdwardsPoint *)((long)&A->X + 1);
    }
    i = i + 1;
  }
  mp_free((mp_int *)a);
  ecc_edwards_curve_free((EdwardsCurve *)y);
  return;
}

Assistant:

static void test_ecc_edwards_decompress(void)
{
    EdwardsCurve *ec = ecurve();

    /* As in the mp_modsqrt test, prime the lazy initialisation of the
     * ModsqrtContext */
    mp_int *y = mp_new(144);
    EdwardsPoint *a = ecc_edwards_point_new_from_y(ec, y, 0);
    if (a)                 /* don't care whether this one succeeded */
        ecc_edwards_point_free(a);

    for (size_t p = 0; p < looplimit(2); p++) {
        for (size_t i = 0; i < looplimit(5); i++) {
            EdwardsPoint *A = epoint(ec, i);
            mp_int *Y;
            ecc_edwards_get_affine(A, NULL, &Y);
            mp_copy_into(y, Y);
            mp_free(Y);
            ecc_edwards_point_free(A);

            log_start();
            EdwardsPoint *a = ecc_edwards_point_new_from_y(ec, y, p);
            log_end();

            ecc_edwards_point_free(a);
        }
    }
    mp_free(y);
    ecc_edwards_curve_free(ec);
}